

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_importedComponentConnectionAndParse_Test::
~Connection_importedComponentConnectionAndParse_Test
          (Connection_importedComponentConnectionAndParse_Test *this)

{
  Connection_importedComponentConnectionAndParse_Test *this_local;
  
  ~Connection_importedComponentConnectionAndParse_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, importedComponentConnectionAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"component_in_that_model\" name=\"component_in_this_model\"/>\n"
        "  </import>\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"second\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component_in_this_model\" component_2=\"component_bob\">\n"
        "    <map_variables variable_1=\"variable_import\" variable_2=\"variable_bob\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    libcellml::ComponentPtr componentImported = libcellml::Component::create();
    libcellml::ComponentPtr componentBob = libcellml::Component::create();
    libcellml::VariablePtr variableImported = libcellml::Variable::create();
    libcellml::VariablePtr variableBob = libcellml::Variable::create();

    imp->setUrl("some-other-model.xml");
    componentImported->setName("component_in_this_model");
    componentImported->setSourceComponent(imp, "component_in_that_model");
    componentBob->setName("component_bob");
    variableImported->setName("variable_import");
    variableBob->setName("variable_bob");
    variableBob->setUnits("second");

    m->addComponent(componentImported);
    m->addComponent(componentBob);
    componentImported->addVariable(variableImported);
    componentBob->addVariable(variableBob);
    EXPECT_EQ(variableImported, componentImported->variable(0));

    libcellml::Variable::addEquivalence(variableImported, variableBob);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(size_t(1), parser->issueCount());

    a = printer->printModel(model);
    EXPECT_EQ(e, a);
}